

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

bool __thiscall
QPDFWriter::willFilterStream
          (QPDFWriter *this,QPDFObjectHandle *stream,bool *compress_stream,bool *is_root_metadata,
          string *stream_data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  qpdf_stream_decode_level_e decode_level;
  bool bVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  uint encode_flags;
  long lVar6;
  element_type *peVar7;
  bool bVar8;
  PipelinePopper pp_stream_data;
  QPDFObjectHandle filter_obj;
  QPDFObjectHandle stream_dict;
  QPDFObjGen old_og;
  bool local_fd;
  uint local_fc;
  string local_f8;
  QPDFObjectHandle *local_d8;
  undefined2 local_ca;
  string local_c8;
  bool *local_a8;
  PipelinePopper local_a0;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_90;
  QPDFObjectHandle local_88 [2];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  *compress_stream = false;
  *is_root_metadata = false;
  local_a8 = compress_stream;
  local_58[0]._0_8_ = QPDFObjectHandle::getObjGen(stream);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_68);
  local_d8 = stream;
  bVar2 = QPDFObjectHandle::isRootMetadata(stream);
  if (bVar2) {
    *is_root_metadata = true;
  }
  bVar2 = QPDFObjectHandle::isDataModified(local_d8);
  bVar8 = true;
  if ((!bVar2) &&
     (peVar7 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar7->compress_streams == false)) {
    bVar8 = peVar7->stream_decode_level != qpdf_dl_none;
  }
  bVar2 = QPDFObjectHandle::getFilterOnWrite(local_d8);
  local_fd = true;
  if (!bVar2) {
    local_fc = 0;
    bVar8 = false;
    goto LAB_001eda24;
  }
  peVar7 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar7->compress_streams == true) {
    paVar1 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Filter","");
    QPDFObjectHandle::getKey(local_88,(string *)local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    bVar2 = bVar8;
    if (((((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          recompress_flate == false) && (bVar3 = QPDFObjectHandle::isDataModified(local_d8), !bVar3)
        ) && (bVar3 = QPDFObjectHandle::isName(local_88), bVar3)) {
      QPDFObjectHandle::getName_abi_cxx11_(&local_f8,local_88);
      iVar4 = std::__cxx11::string::compare((char *)&local_f8);
      if (iVar4 == 0) {
        bVar3 = true;
      }
      else {
        QPDFObjectHandle::getName_abi_cxx11_(&local_c8,local_88);
        iVar4 = std::__cxx11::string::compare((char *)&local_c8);
        bVar3 = iVar4 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
      if (!bVar3) {
        bVar2 = bVar8;
      }
    }
    bVar8 = bVar2;
    if (local_88[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88[0].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    peVar7 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (*is_root_metadata == true) {
    bVar2 = true;
    bVar3 = false;
    if ((peVar7->encrypted == true) && (bVar3 = false, peVar7->encrypt_metadata != false))
    goto LAB_001ed9ae;
  }
  else {
LAB_001ed9ae:
    if ((peVar7->normalize_content == true) &&
       (cVar5 = std::
                _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                ::find(&(peVar7->normalized_streams)._M_t,(key_type *)(local_68 + 0x10)),
       cVar5._M_node != &(peVar7->normalized_streams)._M_t._M_impl.super__Rb_tree_header._M_header))
    {
      local_fd = true;
      local_fc = 2;
      bVar8 = true;
      goto LAB_001eda24;
    }
    if (bVar8 == false) {
      local_fc = 0;
      goto LAB_001eda24;
    }
    local_fc = 0;
    local_fd = true;
    bVar2 = bVar8;
    bVar3 = true;
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        compress_streams != true) goto LAB_001eda24;
  }
  local_fd = bVar3;
  bVar8 = bVar2;
  *local_a8 = local_fd;
  local_fc = 0;
LAB_001eda24:
  local_ca = 1;
  lVar6 = 0;
  while( true ) {
    bVar2 = *(bool *)((long)&local_ca + lVar6);
    local_a0.stack_id = 0;
    local_a0.qw = this;
    if (stream_data == (string *)0x0) {
      local_90._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
           (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
      activatePipelineStack
                (this,&local_a0,true,(string *)0x0,
                 (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_90);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_90);
    }
    else {
      activatePipelineStack(this,&local_a0,stream_data);
    }
    peVar7 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    encode_flags = *local_a8 | local_fc;
    if (bVar8 == false) {
      encode_flags = 0;
    }
    if ((bVar8 & local_fd) == 1) {
      decode_level = peVar7->stream_decode_level;
    }
    else {
      decode_level = (uint)bVar8 * 3;
    }
    bVar2 = QPDFObjectHandle::pipeStreamData
                      (local_d8,&peVar7->pipeline->super_Pipeline,encode_flags,decode_level,false,
                       bVar2);
    if (bVar8 != true || bVar2) break;
    QPDFObjectHandle::setFilterOnWrite(local_d8,false);
    if (stream_data != (string *)0x0) {
      stream_data->_M_string_length = 0;
      *(stream_data->_M_dataplus)._M_p = '\0';
    }
    PipelinePopper::~PipelinePopper(&local_a0);
    lVar6 = lVar6 + 1;
    bVar8 = false;
    if (lVar6 == 2) {
LAB_001edc8b:
      *local_a8 = false;
      bVar8 = false;
LAB_001edc95:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      return bVar8;
    }
  }
  PipelinePopper::~PipelinePopper(&local_a0);
  bVar8 = true;
  if (bVar2) goto LAB_001edc95;
  goto LAB_001edc8b;
}

Assistant:

bool
QPDFWriter::willFilterStream(
    QPDFObjectHandle stream,
    bool& compress_stream,  // out only
    bool& is_root_metadata, // out only
    std::string* stream_data)
{
    compress_stream = false;
    is_root_metadata = false;

    QPDFObjGen old_og = stream.getObjGen();
    QPDFObjectHandle stream_dict = stream.getDict();

    if (stream.isRootMetadata()) {
        is_root_metadata = true;
    }
    bool filter = stream.isDataModified() || m->compress_streams || m->stream_decode_level;
    bool filter_on_write = stream.getFilterOnWrite();
    if (!filter_on_write) {
        QTC::TC("qpdf", "QPDFWriter getFilterOnWrite false");
        filter = false;
    }
    if (filter_on_write && m->compress_streams) {
        // Don't filter if the stream is already compressed with FlateDecode. This way we don't make
        // it worse if the original file used a better Flate algorithm, and we don't spend time and
        // CPU cycles uncompressing and recompressing stuff. This can be overridden with
        // setRecompressFlate(true).
        QPDFObjectHandle filter_obj = stream_dict.getKey("/Filter");
        if (!m->recompress_flate && !stream.isDataModified() && filter_obj.isName() &&
            (filter_obj.getName() == "/FlateDecode" || filter_obj.getName() == "/Fl")) {
            QTC::TC("qpdf", "QPDFWriter not recompressing /FlateDecode");
            filter = false;
        }
    }
    bool normalize = false;
    bool uncompress = false;
    if (filter_on_write && is_root_metadata && (!m->encrypted || !m->encrypt_metadata)) {
        QTC::TC("qpdf", "QPDFWriter not compressing metadata");
        filter = true;
        compress_stream = false;
        uncompress = true;
    } else if (filter_on_write && m->normalize_content && m->normalized_streams.count(old_og)) {
        normalize = true;
        filter = true;
    } else if (filter_on_write && filter && m->compress_streams) {
        compress_stream = true;
        QTC::TC("qpdf", "QPDFWriter compressing uncompressed stream");
    }

    bool filtered = false;
    for (bool first_attempt: {true, false}) {
        PipelinePopper pp_stream_data(this);
        if (stream_data != nullptr) {
            activatePipelineStack(pp_stream_data, *stream_data);
        } else {
            activatePipelineStack(pp_stream_data, true);
        }
        try {
            filtered = stream.pipeStreamData(
                m->pipeline,
                !filter ? 0
                        : ((normalize ? qpdf_ef_normalize : 0) |
                           (compress_stream ? qpdf_ef_compress : 0)),
                !filter ? qpdf_dl_none : (uncompress ? qpdf_dl_all : m->stream_decode_level),
                false,
                first_attempt);
            if (filter && !filtered) {
                // Try again
                filter = false;
                stream.setFilterOnWrite(false);
            } else {
                break;
            }
        } catch (std::runtime_error& e) {
            if (filter && first_attempt) {
                stream.warnIfPossible("error while getting stream data: "s + e.what());
                stream.warnIfPossible("qpdf will attempt to write the damaged stream unchanged");
                filter = false;
                stream.setFilterOnWrite(false);
                continue;
            }
            throw std::runtime_error(
                "error while getting stream data for " + stream.unparse() + ": " + e.what());
        }
        if (stream_data) {
            stream_data->clear();
        }
    }
    if (!filtered) {
        compress_stream = false;
    }
    return filtered;
}